

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureShadowTests.cpp
# Opt level: O0

void vkt::texture::anon_unknown_0::populateTextureShadowTests(TestCaseGroup *textureShadowTests)

{
  undefined8 uVar1;
  TestCaseGroup *pTVar2;
  TestNode *pTVar3;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance> *this;
  char *pcVar4;
  TestNode *pTVar5;
  TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance> *this_00;
  TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance> *this_01;
  allocator<char> local_3e9;
  string local_3e8;
  allocator<char> local_3c1;
  string local_3c0;
  value_type local_39c;
  undefined1 local_398 [8];
  Texture2DArrayShadowTestCaseParameters testParameters_2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_340;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_320;
  undefined1 local_300 [8];
  string name_2;
  int local_2d8;
  int formatNdx_2;
  int compareNdx_2;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> filterGroup_2;
  int filterNdx_2;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group2DArray;
  string local_2a0;
  allocator<char> local_279;
  string local_278;
  value_type local_254;
  undefined1 local_250 [8];
  TextureCubeShadowTestCaseParameters testParameters_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  undefined1 local_1c0 [8];
  string name_1;
  int local_198;
  int formatNdx_1;
  int compareNdx_1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> filterGroup_1;
  int filterNdx_1;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> groupCube;
  string local_160;
  allocator<char> local_139;
  string local_138;
  value_type local_114;
  undefined1 local_110 [8];
  Texture2DShadowTestCaseParameters testParameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  undefined1 local_80 [8];
  string name;
  int local_58;
  int formatNdx;
  int compareNdx;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> filterGroup;
  DefaultDeleter<tcu::TestCaseGroup> local_35;
  int filterNdx;
  undefined1 local_28 [8];
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group2D;
  TestContext *testCtx;
  TestCaseGroup *textureShadowTests_local;
  
  group2D.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data._8_8_
       = tcu::TestNode::getTestContext(&textureShadowTests->super_TestNode);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    group2D.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"2d","2D texture shadow lookup tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter(&local_35);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28,pTVar2
            );
  for (filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._12_4_ = 0;
      (int)filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data._12_4_ < 6;
      filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._12_4_ =
           filterGroup.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
           .m_data._12_4_ + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,(TestContext *)
                      group2D.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_,
               populateTextureShadowTests::filters
               [(int)filterGroup.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._12_4_].name,"");
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&formatNdx + 3));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&compareNdx,
               pTVar2);
    for (local_58 = 0; local_58 < 8; local_58 = local_58 + 1) {
      for (name.field_2._12_4_ = 0; (int)name.field_2._12_4_ < 6;
          name.field_2._12_4_ = name.field_2._12_4_ + 1) {
        pcVar4 = populateTextureShadowTests::compareOp[local_58].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c0,pcVar4,(allocator<char> *)&testParameters.field_0x47);
        std::operator+(&local_a0,&local_c0,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80
                       ,&local_a0,populateTextureShadowTests::formats[(int)name.field_2._12_4_].name
                      );
        std::__cxx11::string::~string((string *)&local_a0);
        std::__cxx11::string::~string((string *)&local_c0);
        std::allocator<char>::~allocator((allocator<char> *)&testParameters.field_0x47);
        Texture2DShadowTestCaseParameters::Texture2DShadowTestCaseParameters
                  ((Texture2DShadowTestCaseParameters *)local_110);
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
        sampleCount = populateTextureShadowTests::filters
                      [(int)filterGroup.
                            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            .m_data._12_4_].minFilter;
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
        texCoordPrecision =
             populateTextureShadowTests::filters
             [(int)filterGroup.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._12_4_].magFilter;
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.wrapS
             = populateTextureShadowTests::formats[(int)name.field_2._12_4_].format;
        testParameters.super_Texture2DTestCaseParameters.width =
             populateTextureShadowTests::compareOp[local_58].op;
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
        minFilter = NEAREST_MIPMAP_NEAREST;
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
        magFilter = NEAREST_MIPMAP_NEAREST;
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
        programs.
        super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x20;
        testParameters.super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.
        programs.
        super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x40;
        local_114 = PROGRAM_2D_SHADOW;
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                   *)&testParameters.super_Texture2DTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,&local_114);
        pTVar3 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)&compareNdx)->super_TestNode;
        this = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance> *)
               operator_new(0xb8);
        uVar1 = group2D.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_8_;
        groupCube.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data._14_1_ = 1;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,pcVar4,&local_139);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_160,"",
                   (allocator<char> *)
                   &groupCube.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0xf);
        util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DShadowTestInstance>::
        TextureTestCase(this,(TestContext *)uVar1,&local_138,&local_160,(ParameterType *)local_110);
        groupCube.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data._14_1_ = 0;
        tcu::TestNode::addChild(pTVar3,(TestNode *)this);
        std::__cxx11::string::~string((string *)&local_160);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &groupCube.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0xf);
        std::__cxx11::string::~string((string *)&local_138);
        std::allocator<char>::~allocator(&local_139);
        Texture2DShadowTestCaseParameters::~Texture2DShadowTestCaseParameters
                  ((Texture2DShadowTestCaseParameters *)local_110);
        std::__cxx11::string::~string((string *)local_80);
      }
    }
    pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         local_28)->super_TestNode;
    pTVar5 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      &compareNdx)->super_TestNode;
    tcu::TestNode::addChild(pTVar3,pTVar5);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&compareNdx);
  }
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28
                   )->super_TestNode;
  tcu::TestNode::addChild(&textureShadowTests->super_TestNode,pTVar3);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)local_28);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    group2D.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"cube","Cube map texture shadow lookup tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &filterGroup_1.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&filterNdx_1,
             pTVar2);
  for (filterGroup_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._8_4_ = 0;
      (int)filterGroup_1.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _8_4_ < 6;
      filterGroup_1.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._8_4_ = filterGroup_1.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_ + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,(TestContext *)
                      group2D.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_,
               populateTextureShadowTests::filters
               [(int)filterGroup_1.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].name,"");
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&formatNdx_1 + 3));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&compareNdx_1
               ,pTVar2);
    for (local_198 = 0; local_198 < 8; local_198 = local_198 + 1) {
      for (name_1.field_2._12_4_ = 0; (int)name_1.field_2._12_4_ < 6;
          name_1.field_2._12_4_ = name_1.field_2._12_4_ + 1) {
        pcVar4 = populateTextureShadowTests::compareOp[local_198].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_200,pcVar4,
                   (allocator<char> *)
                   &testParameters_1.super_TextureCubeTestCaseParameters.field_0x3f);
        std::operator+(&local_1e0,&local_200,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_1c0,&local_1e0,
                       populateTextureShadowTests::formats[(int)name_1.field_2._12_4_].name);
        std::__cxx11::string::~string((string *)&local_1e0);
        std::__cxx11::string::~string((string *)&local_200);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &testParameters_1.super_TextureCubeTestCaseParameters.field_0x3f);
        TextureCubeShadowTestCaseParameters::TextureCubeShadowTestCaseParameters
                  ((TextureCubeShadowTestCaseParameters *)local_250);
        testParameters_1.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
        sampleCount = populateTextureShadowTests::filters
                      [(int)filterGroup_1.
                            super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                            .m_data._8_4_].minFilter;
        testParameters_1.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
        texCoordPrecision =
             populateTextureShadowTests::filters
             [(int)filterGroup_1.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._8_4_].magFilter;
        testParameters_1.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
        wrapS = populateTextureShadowTests::formats[(int)name_1.field_2._12_4_].format;
        local_250._0_4_ = populateTextureShadowTests::compareOp[local_198].op;
        testParameters_1.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
        minFilter = NEAREST_MIPMAP_NEAREST;
        testParameters_1.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
        magFilter = NEAREST_MIPMAP_NEAREST;
        testParameters_1.super_TextureCubeTestCaseParameters.super_TextureCommonTestCaseParameters.
        programs.
        super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x20;
        local_254 = PROGRAM_CUBE_SHADOW;
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                   *)&testParameters_1.super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.format,&local_254);
        pTVar3 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)&compareNdx_1)->super_TestNode;
        this_00 = (TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance>
                   *)operator_new(0xb8);
        uVar1 = group2D.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_8_;
        group2DArray.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data._14_1_ = 1;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_278,pcVar4,&local_279);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_2a0,"",
                   (allocator<char> *)
                   &group2DArray.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0xf);
        util::TextureTestCase<vkt::texture::(anonymous_namespace)::TextureCubeShadowTestInstance>::
        TextureTestCase(this_00,(TestContext *)uVar1,&local_278,&local_2a0,
                        (ParameterType *)local_250);
        group2DArray.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
        m_data._14_1_ = 0;
        tcu::TestNode::addChild(pTVar3,(TestNode *)this_00);
        std::__cxx11::string::~string((string *)&local_2a0);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &group2DArray.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data.field_0xf);
        std::__cxx11::string::~string((string *)&local_278);
        std::allocator<char>::~allocator(&local_279);
        TextureCubeShadowTestCaseParameters::~TextureCubeShadowTestCaseParameters
                  ((TextureCubeShadowTestCaseParameters *)local_250);
        std::__cxx11::string::~string((string *)local_1c0);
      }
    }
    pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         &filterNdx_1)->super_TestNode;
    pTVar5 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      &compareNdx_1)->super_TestNode;
    tcu::TestNode::addChild(pTVar3,pTVar5);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&compareNdx_1
              );
  }
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &filterNdx_1)->super_TestNode;
  tcu::TestNode::addChild(&textureShadowTests->super_TestNode,pTVar3);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&filterNdx_1);
  pTVar2 = (TestCaseGroup *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            (pTVar2,(TestContext *)
                    group2D.
                    super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                    m_data._8_8_,"2d_array","2D texture array shadow lookup tests");
  de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
            ((DefaultDeleter<tcu::TestCaseGroup> *)
             &filterGroup_2.
              super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
              field_0xf);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&filterNdx_2,
             pTVar2);
  for (filterGroup_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
       m_data._8_4_ = 0;
      (int)filterGroup_2.
           super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.
           _8_4_ < 6;
      filterGroup_2.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
      m_data._8_4_ = filterGroup_2.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_ + 1) {
    pTVar2 = (TestCaseGroup *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              (pTVar2,(TestContext *)
                      group2D.
                      super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                      m_data._8_8_,
               populateTextureShadowTests::filters
               [(int)filterGroup_2.
                     super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                     m_data._8_4_].name,"");
    de::DefaultDeleter<tcu::TestCaseGroup>::DefaultDeleter
              ((DefaultDeleter<tcu::TestCaseGroup> *)((long)&formatNdx_2 + 3));
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&compareNdx_2
               ,pTVar2);
    for (local_2d8 = 0; local_2d8 < 8; local_2d8 = local_2d8 + 1) {
      for (name_2.field_2._12_4_ = 0; (int)name_2.field_2._12_4_ < 6;
          name_2.field_2._12_4_ = name_2.field_2._12_4_ + 1) {
        pcVar4 = populateTextureShadowTests::compareOp[local_2d8].name;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_340,pcVar4,
                   (allocator<char> *)
                   &testParameters_2.super_Texture2DArrayTestCaseParameters.field_0x47);
        std::operator+(&local_320,&local_340,"_");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_300,&local_320,
                       populateTextureShadowTests::formats[(int)name_2.field_2._12_4_].name);
        std::__cxx11::string::~string((string *)&local_320);
        std::__cxx11::string::~string((string *)&local_340);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   &testParameters_2.super_Texture2DArrayTestCaseParameters.field_0x47);
        Texture2DArrayShadowTestCaseParameters::Texture2DArrayShadowTestCaseParameters
                  ((Texture2DArrayShadowTestCaseParameters *)local_398);
        testParameters_2.super_Texture2DArrayTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.sampleCount =
             populateTextureShadowTests::filters
             [(int)filterGroup_2.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._8_4_].minFilter;
        testParameters_2.super_Texture2DArrayTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.texCoordPrecision =
             populateTextureShadowTests::filters
             [(int)filterGroup_2.
                   super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
                   m_data._8_4_].magFilter;
        testParameters_2.super_Texture2DArrayTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.wrapS =
             populateTextureShadowTests::formats[(int)name_2.field_2._12_4_].format;
        local_398._0_4_ = populateTextureShadowTests::compareOp[local_2d8].op;
        testParameters_2.super_Texture2DArrayTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.minFilter = NEAREST_MIPMAP_NEAREST;
        testParameters_2.super_Texture2DArrayTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.magFilter = NEAREST_MIPMAP_NEAREST;
        testParameters_2.super_Texture2DArrayTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.programs.
        super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0x20;
        testParameters_2.super_Texture2DArrayTestCaseParameters.super_Texture2DTestCaseParameters.
        super_TextureCommonTestCaseParameters.programs.
        super__Vector_base<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x40;
        testParameters_2.super_Texture2DArrayTestCaseParameters.super_Texture2DTestCaseParameters.
        width = 8;
        local_39c = PROGRAM_2D_ARRAY_SHADOW;
        std::vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>::
        push_back((vector<vkt::texture::util::Program,_std::allocator<vkt::texture::util::Program>_>
                   *)&testParameters_2.super_Texture2DArrayTestCaseParameters.
                      super_Texture2DTestCaseParameters.super_TextureCommonTestCaseParameters.format
                  ,&local_39c);
        pTVar3 = &de::details::
                  UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
                  operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>
                              *)&compareNdx_2)->super_TestNode;
        this_01 = (TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>
                   *)operator_new(0xc0);
        uVar1 = group2D.
                super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data
                ._8_8_;
        pcVar4 = (char *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3c0,pcVar4,&local_3c1);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"",&local_3e9);
        util::TextureTestCase<vkt::texture::(anonymous_namespace)::Texture2DArrayShadowTestInstance>
        ::TextureTestCase(this_01,(TestContext *)uVar1,&local_3c0,&local_3e8,
                          (ParameterType *)local_398);
        tcu::TestNode::addChild(pTVar3,(TestNode *)this_01);
        std::__cxx11::string::~string((string *)&local_3e8);
        std::allocator<char>::~allocator(&local_3e9);
        std::__cxx11::string::~string((string *)&local_3c0);
        std::allocator<char>::~allocator(&local_3c1);
        Texture2DArrayShadowTestCaseParameters::~Texture2DArrayShadowTestCaseParameters
                  ((Texture2DArrayShadowTestCaseParameters *)local_398);
        std::__cxx11::string::~string((string *)local_300);
      }
    }
    pTVar3 = &de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              operator->((UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                         &filterNdx_2)->super_TestNode;
    pTVar5 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
              release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                      &compareNdx_2)->super_TestNode;
    tcu::TestNode::addChild(pTVar3,pTVar5);
    de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
              ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&compareNdx_2
              );
  }
  pTVar3 = &de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::
            release((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)
                    &filterNdx_2)->super_TestNode;
  tcu::TestNode::addChild(&textureShadowTests->super_TestNode,pTVar3);
  de::details::MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~MovePtr
            ((MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> *)&filterNdx_2);
  return;
}

Assistant:

void populateTextureShadowTests (tcu::TestCaseGroup* textureShadowTests)
{
	tcu::TestContext&				testCtx				= textureShadowTests->getTestContext();

	static const struct
	{
		const char*		name;
		const VkFormat	format;
	} formats[] =
	{
		{ "d16_unorm",				VK_FORMAT_D16_UNORM				},
		{ "x8_d24_unorm_pack32",	VK_FORMAT_X8_D24_UNORM_PACK32	},
		{ "d32_sfloat",				VK_FORMAT_D32_SFLOAT			},
		{ "d16_unorm_s8_uint",		VK_FORMAT_D16_UNORM_S8_UINT		},
		{ "d24_unorm_s8_uint",		VK_FORMAT_D24_UNORM_S8_UINT		},
		{ "d32_sfloat_s8_uint",		VK_FORMAT_D32_SFLOAT_S8_UINT	}
	};

	static const struct
	{
		const char*					name;
		const Sampler::FilterMode	minFilter;
		const Sampler::FilterMode	magFilter;
	} filters[] =
	{
		{ "nearest",				Sampler::NEAREST,					Sampler::NEAREST	},
		{ "linear",					Sampler::LINEAR,					Sampler::LINEAR		},
		{ "nearest_mipmap_nearest",	Sampler::NEAREST_MIPMAP_NEAREST,	Sampler::LINEAR		},
		{ "linear_mipmap_nearest",	Sampler::LINEAR_MIPMAP_NEAREST,		Sampler::LINEAR		},
		{ "nearest_mipmap_linear",	Sampler::NEAREST_MIPMAP_LINEAR,		Sampler::LINEAR		},
		{ "linear_mipmap_linear",	Sampler::LINEAR_MIPMAP_LINEAR,		Sampler::LINEAR		}
	};

	static const struct
	{
		const char*					name;
		const Sampler::CompareMode	op;
	} compareOp[] =
	{
		{ "less_or_equal",		Sampler::COMPAREMODE_LESS_OR_EQUAL		},
		{ "greater_or_equal",	Sampler::COMPAREMODE_GREATER_OR_EQUAL	},
		{ "less",				Sampler::COMPAREMODE_LESS				},
		{ "greater",			Sampler::COMPAREMODE_GREATER			},
		{ "equal",				Sampler::COMPAREMODE_EQUAL				},
		{ "not_equal",			Sampler::COMPAREMODE_NOT_EQUAL			},
		{ "always",				Sampler::COMPAREMODE_ALWAYS				},
		{ "never",				Sampler::COMPAREMODE_NEVER				}
	};

	// 2D cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2D	(new tcu::TestCaseGroup(testCtx, "2d", "2D texture shadow lookup tests"));

		for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(filters); filterNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup>	filterGroup	(new tcu::TestCaseGroup(testCtx, filters[filterNdx].name, ""));

			for (int compareNdx = 0; compareNdx < DE_LENGTH_OF_ARRAY(compareOp); compareNdx++)
			{
				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const string						name			= string(compareOp[compareNdx].name) + "_" + formats[formatNdx].name;
					Texture2DShadowTestCaseParameters	testParameters;

					testParameters.minFilter	= filters[filterNdx].minFilter;
					testParameters.magFilter	= filters[filterNdx].magFilter;
					testParameters.format		= formats[formatNdx].format;
					testParameters.compareOp	= compareOp[compareNdx].op;
					testParameters.wrapS		= Sampler::REPEAT_GL;
					testParameters.wrapT		= Sampler::REPEAT_GL;
					testParameters.width		= 32;
					testParameters.height		= 64;

					testParameters.programs.push_back(PROGRAM_2D_SHADOW);

					filterGroup->addChild(new TextureTestCase<Texture2DShadowTestInstance>(testCtx, name.c_str(), "", testParameters));
				}
			}

			group2D->addChild(filterGroup.release());
		}

		textureShadowTests->addChild(group2D.release());
	}

	// Cubemap cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	groupCube	(new tcu::TestCaseGroup(testCtx, "cube", "Cube map texture shadow lookup tests"));

		for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(filters); filterNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup>	filterGroup	(new tcu::TestCaseGroup(testCtx, filters[filterNdx].name, ""));

			for (int compareNdx = 0; compareNdx < DE_LENGTH_OF_ARRAY(compareOp); compareNdx++)
			{
				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const string							name			= string(compareOp[compareNdx].name) + "_" + formats[formatNdx].name;
					TextureCubeShadowTestCaseParameters		testParameters;

					testParameters.minFilter	= filters[filterNdx].minFilter;
					testParameters.magFilter	= filters[filterNdx].magFilter;
					testParameters.format		= formats[formatNdx].format;
					testParameters.compareOp	= compareOp[compareNdx].op;
					testParameters.wrapS		= Sampler::REPEAT_GL;
					testParameters.wrapT		= Sampler::REPEAT_GL;
					testParameters.size			= 32;

					testParameters.programs.push_back(PROGRAM_CUBE_SHADOW);

					filterGroup->addChild(new TextureTestCase<TextureCubeShadowTestInstance>(testCtx, name.c_str(), "", testParameters));
				}
			}

			groupCube->addChild(filterGroup.release());
		}

		textureShadowTests->addChild(groupCube.release());
	}

	// 2D array cases.
	{
		de::MovePtr<tcu::TestCaseGroup>	group2DArray	(new tcu::TestCaseGroup(testCtx, "2d_array", "2D texture array shadow lookup tests"));

		for (int filterNdx = 0; filterNdx < DE_LENGTH_OF_ARRAY(filters); filterNdx++)
		{
			de::MovePtr<tcu::TestCaseGroup>	filterGroup	(new tcu::TestCaseGroup(testCtx, filters[filterNdx].name, ""));

			for (int compareNdx = 0; compareNdx < DE_LENGTH_OF_ARRAY(compareOp); compareNdx++)
			{
				for (int formatNdx = 0; formatNdx < DE_LENGTH_OF_ARRAY(formats); formatNdx++)
				{
					const string							name			= string(compareOp[compareNdx].name) + "_" + formats[formatNdx].name;
					Texture2DArrayShadowTestCaseParameters	testParameters;

					testParameters.minFilter	= filters[filterNdx].minFilter;
					testParameters.magFilter	= filters[filterNdx].magFilter;
					testParameters.format		= formats[formatNdx].format;
					testParameters.compareOp	= compareOp[compareNdx].op;
					testParameters.wrapS		= Sampler::REPEAT_GL;
					testParameters.wrapT		= Sampler::REPEAT_GL;
					testParameters.width		= 32;
					testParameters.height		= 64;
					testParameters.numLayers	= 8;

					testParameters.programs.push_back(PROGRAM_2D_ARRAY_SHADOW);

					filterGroup->addChild(new TextureTestCase<Texture2DArrayShadowTestInstance>(testCtx, name.c_str(), "", testParameters));
				}
			}

			group2DArray->addChild(filterGroup.release());
		}

		textureShadowTests->addChild(group2DArray.release());
	}
}